

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_table_functions.cpp
# Opt level: O0

void my_bind(duckdb_bind_info info)

{
  StringRef capturedExpression;
  ExprLhs<const_unsigned_long_&> *this;
  ExprLhs<const_unsigned_long_&> expr;
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined8 in_RDI;
  duckdb_value param;
  my_bind_data_struct *my_bind_data;
  duckdb_logical_type type;
  AssertionHandler catchAssertionHandler;
  Decomposer *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  AssertionHandler *this_00;
  StringRef *in_stack_ffffffffffffff08;
  AssertionHandler *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  size_type in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff30;
  AssertionHandler local_70;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_70.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
  this_00 = &local_70;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/capi_table_functions.cpp"
             ,0xb);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  capturedExpression.m_size = in_stack_ffffffffffffff20;
  capturedExpression.m_start = in_stack_ffffffffffffff18;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(SourceLineInfo *)this_00,
             capturedExpression,(Flags)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  this = (ExprLhs<const_unsigned_long_&> *)duckdb_bind_get_parameter_count(local_8);
  expr = Catch::Decomposer::operator<=(in_stack_fffffffffffffef8,(unsigned_long *)0x364fdf);
  Catch::ExprLhs<unsigned_long_const&>::operator==(this,in_stack_ffffffffffffff30);
  Catch::AssertionHandler::handleExpr(this_00,(ITransientExpression *)expr.m_lhs);
  Catch::BinaryExpr<const_unsigned_long_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_int_&> *)0x36502a);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  uVar1 = duckdb_create_logical_type(5);
  duckdb_bind_add_result_column(local_8,"forty_two",uVar1);
  duckdb_destroy_logical_type(&stack0xffffffffffffff20);
  puVar2 = (undefined8 *)malloc(8);
  uVar1 = duckdb_bind_get_parameter(local_8,0);
  uVar1 = duckdb_get_int64(uVar1);
  *puVar2 = uVar1;
  duckdb_destroy_value(&stack0xffffffffffffff10);
  duckdb_bind_set_bind_data(local_8,puVar2,free);
  return;
}

Assistant:

void my_bind(duckdb_bind_info info) {
	REQUIRE(duckdb_bind_get_parameter_count(info) == 1);

	duckdb_logical_type type = duckdb_create_logical_type(DUCKDB_TYPE_BIGINT);
	duckdb_bind_add_result_column(info, "forty_two", type);
	duckdb_destroy_logical_type(&type);

	auto my_bind_data = (my_bind_data_struct *)malloc(sizeof(my_bind_data_struct));
	auto param = duckdb_bind_get_parameter(info, 0);
	my_bind_data->size = duckdb_get_int64(param);
	duckdb_destroy_value(&param);

	duckdb_bind_set_bind_data(info, my_bind_data, free);
}